

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergePartialFromCodedStream
          (CodeGeneratorResponse *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  uint uVar5;
  Limit limit;
  string *value;
  CodeGeneratorResponse_File *this_00;
  uint8 *puVar6;
  uint32 tag;
  int iVar7;
  uint32 local_3c;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->file_).super_RepeatedPtrFieldBase;
  do {
    while( true ) {
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (tag = (uint32)(char)*puVar6, -1 < (char)*puVar6)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar6 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar5 = tag & 7;
      if (tag >> 3 == 0xf) break;
      if ((tag >> 3 != 1) || (uVar5 != 2)) goto LAB_00189ca9;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      value = this->error_;
      if (value == (string *)internal::kEmptyString_abi_cxx11_) {
        value = (string *)operator_new(0x20);
        (value->_M_dataplus)._M_p = (pointer)&value->field_2;
        value->_M_string_length = 0;
        (value->field_2)._M_local_buf[0] = '\0';
        this->error_ = value;
      }
      bVar4 = internal::WireFormatLite::ReadString(input,value);
      if (!bVar4) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->error_->_M_dataplus)._M_p,(int)this->error_->_M_string_length,PARSE);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (*puVar6 == 'z')) {
        do {
          input->buffer_ = puVar6 + 1;
LAB_00189cca:
          iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
          iVar7 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
          if (iVar2 < iVar7) {
            ppvVar3 = (this->file_).super_RepeatedPtrFieldBase.elements_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            this_00 = (CodeGeneratorResponse_File *)ppvVar3[iVar2];
          }
          else {
            if (iVar7 == (this->file_).super_RepeatedPtrFieldBase.total_size_) {
              internal::RepeatedPtrFieldBase::Reserve(local_38,iVar7 + 1);
              iVar7 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
            }
            (this->file_).super_RepeatedPtrFieldBase.allocated_size_ = iVar7 + 1;
            this_00 = internal::
                      GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>::
                      New();
            ppvVar3 = (this->file_).super_RepeatedPtrFieldBase.elements_;
            iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
            (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            ppvVar3[iVar2] = this_00;
          }
          puVar6 = input->buffer_;
          if ((puVar6 < input->buffer_end_) && (uVar1 = *puVar6, -1 < (char)uVar1)) {
            input->buffer_ = puVar6 + 1;
            local_3c = (int)(char)uVar1;
          }
          else {
            bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
            if (!bVar4) {
              return false;
            }
          }
          iVar2 = input->recursion_depth_;
          input->recursion_depth_ = iVar2 + 1;
          if (input->recursion_limit_ <= iVar2) {
            return false;
          }
          limit = io::CodedInputStream::PushLimit(input,local_3c);
          bVar4 = CodeGeneratorResponse_File::MergePartialFromCodedStream(this_00,input);
          if (!bVar4) {
            return false;
          }
          if (input->legitimate_message_end_ != true) {
            return false;
          }
          io::CodedInputStream::PopLimit(input,limit);
          if (0 < input->recursion_depth_) {
            input->recursion_depth_ = input->recursion_depth_ + -1;
          }
          puVar6 = input->buffer_;
        } while ((puVar6 < input->buffer_end_) && (*puVar6 == 'z'));
        if ((puVar6 == input->buffer_end_) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          return true;
        }
      }
    }
    if (uVar5 == 2) goto LAB_00189cca;
LAB_00189ca9:
    if (uVar5 == 4) {
      return true;
    }
    bVar4 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string error = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_error()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->error().data(), this->error().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        break;
      }

      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}